

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

int nn_pipe_recv(nn_pipe *self,nn_msg *msg)

{
  int extraout_EAX;
  uint uVar1;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  void *in_RCX;
  int option;
  nn_pipe *unaff_RBX;
  int level;
  nn_pipebase *self_00;
  size_t *in_R8;
  
  level = (int)msg;
  if (self[0x61] == (nn_pipe)0x1) {
    self[0x61] = (nn_pipe)0x2;
    self_00 = (nn_pipebase *)self;
    uVar1 = (**(code **)(*(long *)(self + 0x58) + 8))();
    unaff_RBX = self;
    if (-1 < (int)uVar1) {
      in_RCX = (void *)(ulong)(byte)self[0x61];
      if (self[0x61] == (nn_pipe)0x3) {
        self[0x61] = (nn_pipe)0x1;
        return uVar1;
      }
      goto LAB_0011f3ab;
    }
  }
  else {
    nn_pipe_recv_cold_1();
    uVar1 = extraout_EAX_00;
  }
  self_00 = (nn_pipebase *)(ulong)uVar1;
  nn_pipe_recv_cold_3();
  uVar1 = extraout_EAX_01;
LAB_0011f3ab:
  if ((int)in_RCX == 2) {
    unaff_RBX[0x61] = (nn_pipe)0x4;
    return uVar1 | 1;
  }
  nn_pipe_recv_cold_2();
  nn_pipebase_getopt(self_00,level,option,in_RCX,in_R8);
  return extraout_EAX;
}

Assistant:

int nn_pipe_recv (struct nn_pipe *self, struct nn_msg *msg)
{
    int rc;
    struct nn_pipebase *pipebase;

    pipebase = (struct nn_pipebase*) self;
    nn_assert (pipebase->instate == NN_PIPEBASE_INSTATE_IDLE);
    pipebase->instate = NN_PIPEBASE_INSTATE_RECEIVING;
    rc = pipebase->vfptr->recv (pipebase, msg);
    errnum_assert (rc >= 0, -rc);

    if (nn_fast (pipebase->instate == NN_PIPEBASE_INSTATE_RECEIVED)) {
        pipebase->instate = NN_PIPEBASE_INSTATE_IDLE;
        return rc;
    }
    nn_assert (pipebase->instate == NN_PIPEBASE_INSTATE_RECEIVING);
    pipebase->instate = NN_PIPEBASE_INSTATE_ASYNC;
    return rc | NN_PIPEBASE_RELEASE;
}